

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

quaternion * dja::operator*=(quaternion *a,float_t *b)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  fVar1 = *b;
  uVar3 = (a->im).x;
  uVar4 = (a->im).y;
  fVar2 = (a->im).z;
  a->re = a->re * fVar1;
  (a->im).x = fVar1 * (float)uVar3;
  (a->im).y = fVar1 * (float)uVar4;
  (a->im).z = fVar1 * fVar2;
  return a;
}

Assistant:

Q normalize(const Q& q) {return Q(normalize(V4(q)));}